

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
          (GeneratedCodeInfo_Annotation *this,GeneratedCodeInfo_Annotation *from)

{
  void *pvVar1;
  int32 iVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__GeneratedCodeInfo_Annotation_0042b990;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  RepeatedField<int>::RepeatedField(&this->path_,&from->path_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->source_file_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->source_file_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->source_file_).ptr_);
  }
  iVar2 = from->end_;
  this->begin_ = from->begin_;
  this->end_ = iVar2;
  return;
}

Assistant:

GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(const GeneratedCodeInfo_Annotation& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      path_(from.path_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  source_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_source_file()) {
    source_file_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_file_);
  }
  ::memcpy(&begin_, &from.begin_,
    reinterpret_cast<char*>(&end_) -
    reinterpret_cast<char*>(&begin_) + sizeof(end_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.GeneratedCodeInfo.Annotation)
}